

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python.cc
# Opt level: O2

Import * __thiscall flatbuffers::python::Imports::Import(Imports *this,string *module,string *name)

{
  pointer pIVar1;
  Import import;
  undefined1 local_50 [32];
  _Alloc_hider local_30;
  size_type local_28;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_20;
  
  local_50._0_8_ = local_50 + 0x10;
  local_50._8_8_ = 0;
  local_50[0x10] = '\0';
  local_30._M_p = (pointer)&local_20;
  local_28 = 0;
  local_20._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)local_50);
  std::__cxx11::string::_M_assign((string *)&local_30);
  std::vector<flatbuffers::python::Import,_std::allocator<flatbuffers::python::Import>_>::
  emplace_back<flatbuffers::python::Import>(&this->imports,(Import *)local_50);
  pIVar1 = (this->imports).
           super__Vector_base<flatbuffers::python::Import,_std::allocator<flatbuffers::python::Import>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  python::Import::~Import((Import *)local_50);
  return pIVar1 + -1;
}

Assistant:

const python::Import &python::Imports::Import(const std::string &module,
                                              const std::string &name) {
  python::Import import;
  import.module = module;
  import.name = name;
  imports.push_back(std::move(import));
  return imports.back();
}